

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test::
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *this)

{
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test *this_local;
  
  memset(this,0,0x20);
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherTypeWithCheckingDisabled_Test_003e2870
  ;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherTypeWithCheckingDisabled)
{
    detector->disableAllocationTypeChecking();
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultNewAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    STRCMP_EQUAL("", reporter->message->asCharString());
    detector->enableAllocationTypeChecking();
}